

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::GetNameOrNumberList
          (ithipublisher *this,char *metric_name,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,bool is_number)

{
  int iVar1;
  double dVar2;
  reference pp_Var3;
  long lVar4;
  iterator iVar5;
  iterator iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auStack_50 [4];
  int cmp;
  MetricNameLine current_name;
  double sum;
  size_t line_index;
  bool is_number_local;
  vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list_local;
  char *metric_name_local;
  ithipublisher *this_local;
  
  sum = 0.0;
  current_name.average = 0.0;
  memset(auStack_50,0,0x18);
  do {
    dVar2 = (double)std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::size
                              (&this->line_list);
    if ((ulong)dVar2 <= (ulong)sum) {
LAB_001aafe7:
      while( true ) {
        dVar2 = (double)std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::size
                                  (&this->line_list);
        bVar7 = false;
        if ((ulong)sum < (ulong)dVar2) {
          pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                              (&this->line_list,(size_type)sum);
          iVar1 = strcmp((*pp_Var3)->metric_name,metric_name);
          bVar7 = iVar1 == 0;
        }
        if (!bVar7) break;
        if (_auStack_50 != (char *)0x0) {
          pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                              (&this->line_list,(size_type)sum);
          iVar1 = strcmp((*pp_Var3)->key_value,_auStack_50);
          if (iVar1 != 0) {
            if (1 < this->nb_months) {
              lVar4 = (long)this->nb_months + -1;
              auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar8._0_8_ = lVar4;
              auVar8._12_4_ = 0x45300000;
              current_name.current =
                   current_name.average /
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
            }
            std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::push_back
                      (name_list,(value_type *)auStack_50);
            pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                                (&this->line_list,(size_type)sum);
            _auStack_50 = (*pp_Var3)->key_value;
            current_name.current = 0.0;
            current_name.name = (char *)0x0;
            current_name.average = 0.0;
          }
        }
        pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                            (&this->line_list,(size_type)sum);
        if (((*pp_Var3)->year == this->last_year) &&
           (pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                                (&this->line_list,(size_type)sum),
           (*pp_Var3)->month == this->last_month)) {
          pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                              (&this->line_list,(size_type)sum);
          current_name.name = (char *)(*pp_Var3)->frequency;
        }
        else {
          pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                              (&this->line_list,(size_type)sum);
          current_name.average = (*pp_Var3)->frequency + current_name.average;
        }
        sum = (double)((long)sum + 1);
      }
      if (_auStack_50 != (char *)0x0) {
        if (1 < this->nb_months) {
          lVar4 = (long)this->nb_months + -1;
          auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar9._0_8_ = lVar4;
          auVar9._12_4_ = 0x45300000;
          current_name.current =
               current_name.average /
               ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        }
        std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::push_back
                  (name_list,(value_type *)auStack_50);
      }
      if (is_number) {
        iVar5 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::begin(name_list)
        ;
        iVar6 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::end(name_list);
        std::
        sort<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,bool(*)(_metric_name_line,_metric_name_line)>
                  ((__normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
                    )iVar5._M_current,
                   (__normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
                    )iVar6._M_current,MetricNumberIsLower);
      }
      else {
        iVar5 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::begin(name_list)
        ;
        iVar6 = std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::end(name_list);
        std::
        sort<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,bool(*)(_metric_name_line,_metric_name_line)>
                  ((__normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
                    )iVar5._M_current,
                   (__normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
                    )iVar6._M_current,MetricNameLineIsBigger);
      }
      return true;
    }
    pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                        (&this->line_list,(size_type)sum);
    iVar1 = strcmp((*pp_Var3)->metric_name,metric_name);
    if (0 < iVar1) goto LAB_001aafe7;
    if (iVar1 == 0) {
      pp_Var3 = std::vector<_metric_line_*,_std::allocator<_metric_line_*>_>::operator[]
                          (&this->line_list,(size_type)sum);
      _auStack_50 = (*pp_Var3)->key_value;
      goto LAB_001aafe7;
    }
    sum = (double)((long)sum + 1);
  } while( true );
}

Assistant:

bool ithipublisher::GetNameOrNumberList(char const * metric_name, std::vector<MetricNameLine>* name_list, bool is_number)
{
    size_t line_index = 0;
    double sum = 0;
    MetricNameLine current_name = { NULL, 0, 0 };

    /* Skip to beginning of the metric */
    while (line_index < line_list.size())
    {
        int cmp = strcmp(line_list[line_index]->metric_name, metric_name);

        if (cmp > 0)
        {
            break;
        }
        else if (cmp == 0)
        {
            current_name.name = line_list[line_index]->key_value;
            break;
        }
        line_index++;
    }

    /* Extract the lines and compute the averages */
    while (line_index < line_list.size() && strcmp(line_list[line_index]->metric_name, metric_name) == 0)
    {
        if (current_name.name != NULL && strcmp(line_list[line_index]->key_value, current_name.name) != 0)
        {
            if (nb_months > 1)
            {
                current_name.average = sum / (((size_t)nb_months) - 1);
            }
            name_list->push_back(current_name);
            current_name.name = line_list[line_index]->key_value;
            current_name.average = 0;
            current_name.current = 0;
            sum = 0;
        }
        
        if (line_list[line_index]->year == last_year &&
            line_list[line_index]->month == last_month)
        {
            current_name.current = line_list[line_index]->frequency;
        }
        else
        {
            sum += line_list[line_index]->frequency;
        }

        line_index++;
    }
    /* Push the last entry if it was filled up */
    if (current_name.name != NULL)
    {
        if (nb_months > 1)
        {
            current_name.average = sum / (((size_t)nb_months) - 1);
        }
        name_list->push_back(current_name);
    }

    if (is_number) {
        /* Sort by increasing metric number */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNumberIsLower);
    } else {
        /* Sort from bigger to lower */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNameLineIsBigger);
    }

    return true;
}